

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O1

string * format(string *__return_storage_ptr__,string *fmt_str,...)

{
  string *psVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  char *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  pointer __old_p;
  char *pcVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string str;
  va_list ap;
  allocator<char> local_131;
  string *local_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  iVar4 = (int)fmt_str->_M_string_length * 2;
  local_128 = &local_118;
  local_120 = 0;
  local_118 = 0;
  pcVar5 = (char *)0x0;
  local_130 = __return_storage_ptr__;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while( true ) {
    __dest = (char *)operator_new__((long)iVar4);
    if (pcVar5 != (char *)0x0) {
      operator_delete__(pcVar5);
    }
    strcpy(__dest,(fmt_str->_M_dataplus)._M_p);
    local_108 = 0x3000000010;
    local_100 = &stack0x00000008;
    local_f8 = local_e8;
    iVar2 = vsnprintf(__dest,(long)iVar4,(fmt_str->_M_dataplus)._M_p,&local_108);
    psVar1 = local_130;
    if (-1 < iVar2 && iVar2 < iVar4) break;
    iVar3 = (iVar2 - iVar4) + 1;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    iVar4 = iVar4 + iVar2;
    pcVar5 = __dest;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_130,__dest,&local_131);
  operator_delete__(__dest);
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  return psVar1;
}

Assistant:

std::string format(const std::string fmt_str, ...) {
    int final_n, n = ((int)fmt_str.size()) * 2; /* reserve 2 times as much as the length of the fmt_str */
    std::string str;
    std::unique_ptr<char[]> formatted;
    va_list ap;
    while(1) {
        formatted.reset(new char[n]); /* wrap the plain char array into the unique_ptr */
        strcpy(&formatted[0], fmt_str.c_str());
        va_start(ap, fmt_str);
        final_n = vsnprintf(&formatted[0], n, fmt_str.c_str(), ap);
        va_end(ap);
        if (final_n < 0 || final_n >= n)
            n += abs(final_n - n + 1);
        else
            break;
    }
    return std::string(formatted.get());
}